

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall el::base::LogFormat::parseFromFormat(LogFormat *this,string_t *userFormat)

{
  string *in_RSI;
  long *in_RDI;
  bool bVar1;
  size_t dateIndex;
  anon_class_16_2_fe2d67eb conditionalAddFlag;
  string_t formatCopy;
  char *in_stack_ffffffffffffff88;
  uint7 in_stack_ffffffffffffff90;
  long local_58;
  FormatFlags in_stack_ffffffffffffffb4;
  char_t *in_stack_ffffffffffffffb8;
  anon_class_16_2_fe2d67eb *this_00;
  anon_class_16_2_fe2d67eb local_30 [3];
  
  this_00 = local_30;
  std::__cxx11::string::string((string *)this_00,in_RSI);
  *(undefined4 *)(in_RDI + 0xe) = 0;
  parseFromFormat::anon_class_16_2_fe2d67eb::operator()
            (this_00,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
  parseFromFormat::anon_class_16_2_fe2d67eb::operator()
            (this_00,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
  parseFromFormat::anon_class_16_2_fe2d67eb::operator()
            (this_00,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
  parseFromFormat::anon_class_16_2_fe2d67eb::operator()
            (this_00,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
  parseFromFormat::anon_class_16_2_fe2d67eb::operator()
            (this_00,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
  parseFromFormat::anon_class_16_2_fe2d67eb::operator()
            (this_00,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
  parseFromFormat::anon_class_16_2_fe2d67eb::operator()
            (this_00,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
  parseFromFormat::anon_class_16_2_fe2d67eb::operator()
            (this_00,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
  parseFromFormat::anon_class_16_2_fe2d67eb::operator()
            (this_00,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
  parseFromFormat::anon_class_16_2_fe2d67eb::operator()
            (this_00,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
  parseFromFormat::anon_class_16_2_fe2d67eb::operator()
            (this_00,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
  parseFromFormat::anon_class_16_2_fe2d67eb::operator()
            (this_00,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
  parseFromFormat::anon_class_16_2_fe2d67eb::operator()
            (this_00,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
  parseFromFormat::anon_class_16_2_fe2d67eb::operator()
            (this_00,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
  local_58 = std::__cxx11::string::find((char *)local_30,(ulong)consts::kDateTimeFormatSpecifier);
  if (local_58 != -1) {
    while( true ) {
      bVar1 = false;
      if (local_58 != 0) {
        in_stack_ffffffffffffff88 = (char *)std::__cxx11::string::operator[]((ulong)local_30);
        bVar1 = *in_stack_ffffffffffffff88 == '%';
      }
      if (!bVar1) break;
      local_58 = std::__cxx11::string::find
                           ((char *)local_30,(ulong)consts::kDateTimeFormatSpecifier);
    }
    if (local_58 != -1) {
      addFlag((LogFormat *)(ulong)in_stack_ffffffffffffff90,
              (FormatFlags)((ulong)in_stack_ffffffffffffff88 >> 0x20));
      (**(code **)(*in_RDI + 0x18))(in_RDI,local_58,local_30);
    }
  }
  std::__cxx11::string::operator=((string *)(in_RDI + 6),(string *)local_30);
  (**(code **)(*in_RDI + 0x20))();
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void LogFormat::parseFromFormat(const base::type::string_t& userFormat) {
  // We make copy because we will be changing the format
  // i.e, removing user provided date format from original format
  // and then storing it.
  base::type::string_t formatCopy = userFormat;
  m_flags = 0x0;
  auto conditionalAddFlag = [&](const base::type::char_t* specifier, base::FormatFlags flag) {
    std::size_t foundAt = base::type::string_t::npos;
    while ((foundAt = formatCopy.find(specifier, foundAt + 1)) != base::type::string_t::npos) {
      if (foundAt > 0 && formatCopy[foundAt - 1] == base::consts::kFormatSpecifierChar) {
        if (hasFlag(flag)) {
          // If we already have flag we remove the escape chars so that '%%' is turned to '%'
          // even after specifier resolution - this is because we only replaceFirst specifier
          formatCopy.erase(foundAt > 0 ? foundAt - 1 : 0, 1);
          ++foundAt;
        }
      } else {
        if (!hasFlag(flag)) addFlag(flag);
      }
    }
  };
  conditionalAddFlag(base::consts::kAppNameFormatSpecifier, base::FormatFlags::AppName);
  conditionalAddFlag(base::consts::kSeverityLevelFormatSpecifier, base::FormatFlags::Level);
  conditionalAddFlag(base::consts::kSeverityLevelShortFormatSpecifier, base::FormatFlags::LevelShort);
  conditionalAddFlag(base::consts::kLoggerIdFormatSpecifier, base::FormatFlags::LoggerId);
  conditionalAddFlag(base::consts::kThreadIdFormatSpecifier, base::FormatFlags::ThreadId);
  conditionalAddFlag(base::consts::kLogFileFormatSpecifier, base::FormatFlags::File);
  conditionalAddFlag(base::consts::kLogFileBaseFormatSpecifier, base::FormatFlags::FileBase);
  conditionalAddFlag(base::consts::kLogLineFormatSpecifier, base::FormatFlags::Line);
  conditionalAddFlag(base::consts::kLogLocationFormatSpecifier, base::FormatFlags::Location);
  conditionalAddFlag(base::consts::kLogFunctionFormatSpecifier, base::FormatFlags::Function);
  conditionalAddFlag(base::consts::kCurrentUserFormatSpecifier, base::FormatFlags::User);
  conditionalAddFlag(base::consts::kCurrentHostFormatSpecifier, base::FormatFlags::Host);
  conditionalAddFlag(base::consts::kMessageFormatSpecifier, base::FormatFlags::LogMessage);
  conditionalAddFlag(base::consts::kVerboseLevelFormatSpecifier, base::FormatFlags::VerboseLevel);
  // For date/time we need to extract user's date format first
  std::size_t dateIndex = std::string::npos;
  if ((dateIndex = formatCopy.find(base::consts::kDateTimeFormatSpecifier)) != std::string::npos) {
    while (dateIndex > 0 && formatCopy[dateIndex - 1] == base::consts::kFormatSpecifierChar) {
      dateIndex = formatCopy.find(base::consts::kDateTimeFormatSpecifier, dateIndex + 1);
    }
    if (dateIndex != std::string::npos) {
      addFlag(base::FormatFlags::DateTime);
      updateDateFormat(dateIndex, formatCopy);
    }
  }
  m_format = formatCopy;
  updateFormatSpec();
}